

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::shared_ptr<vmips::VirtReg>,_unsigned_long>,_std::hash<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::pair<const_std::shared_ptr<vmips::VirtReg>,_unsigned_long>_>_>
::destroy_slots(raw_hash_set<phmap::priv::FlatHashMapPolicy<std::shared_ptr<vmips::VirtReg>,_unsigned_long>,_std::hash<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::pair<const_std::shared_ptr<vmips::VirtReg>,_unsigned_long>_>_>
                *this)

{
  bool bVar1;
  allocator_type *paVar2;
  size_t n;
  ctrl_t *pcVar3;
  size_t *psVar4;
  undefined1 local_28 [8];
  Layout layout;
  size_t i;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<std::shared_ptr<vmips::VirtReg>,_unsigned_long>,_std::hash<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::pair<const_std::shared_ptr<vmips::VirtReg>,_unsigned_long>_>_>
  *this_local;
  
  if (this->capacity_ != 0) {
    for (layout.
         super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<std::shared_ptr<vmips::VirtReg>,_unsigned_long>_>
         .size_[1] = 0;
        layout.
        super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<std::shared_ptr<vmips::VirtReg>,_unsigned_long>_>
        .size_[1] != this->capacity_;
        layout.
        super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<std::shared_ptr<vmips::VirtReg>,_unsigned_long>_>
        .size_[1] = layout.
                    super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<std::shared_ptr<vmips::VirtReg>,_unsigned_long>_>
                    .size_[1] + 1) {
      bVar1 = IsFull(this->ctrl_
                     [layout.
                      super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<std::shared_ptr<vmips::VirtReg>,_unsigned_long>_>
                      .size_[1]]);
      if (bVar1) {
        paVar2 = alloc_ref(this);
        hash_policy_traits<phmap::priv::FlatHashMapPolicy<std::shared_ptr<vmips::VirtReg>,unsigned_long>,void>
        ::destroy<std::allocator<std::pair<std::shared_ptr<vmips::VirtReg>const,unsigned_long>>>
                  (paVar2,this->slots_ +
                          layout.
                          super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<std::shared_ptr<vmips::VirtReg>,_unsigned_long>_>
                          .size_[1]);
      }
    }
    _local_28 = (size_t  [2])MakeLayout(this->capacity_);
    SanitizerUnpoisonMemoryRegion(this->slots_,this->capacity_ * 0x18);
    paVar2 = alloc_ref(this);
    pcVar3 = this->ctrl_;
    n = internal_layout::
        LayoutImpl<std::tuple<signed_char,_phmap::priv::map_slot_type<std::shared_ptr<vmips::VirtReg>,_unsigned_long>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
        ::AllocSize((LayoutImpl<std::tuple<signed_char,_phmap::priv::map_slot_type<std::shared_ptr<vmips::VirtReg>,_unsigned_long>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
                     *)local_28);
    Deallocate<8ul,std::allocator<std::pair<std::shared_ptr<vmips::VirtReg>const,unsigned_long>>>
              (paVar2,pcVar3,n);
    pcVar3 = EmptyGroup();
    this->ctrl_ = pcVar3;
    this->slots_ = (slot_type *)0x0;
    this->size_ = 0;
    this->capacity_ = 0;
    psVar4 = growth_left(this);
    *psVar4 = 0;
  }
  return;
}

Assistant:

void destroy_slots() {
        if (!capacity_) return;
        for (size_t i = 0; i != capacity_; ++i) {
            if (IsFull(ctrl_[i])) {
                PolicyTraits::destroy(&alloc_ref(), slots_ + i);
            }
        }
        auto layout = MakeLayout(capacity_);
        // Unpoison before returning the memory to the allocator.
        SanitizerUnpoisonMemoryRegion(slots_, sizeof(slot_type) * capacity_);
        Deallocate<Layout::Alignment()>(&alloc_ref(), ctrl_, layout.AllocSize());
        ctrl_ = EmptyGroup();
        slots_ = nullptr;
        size_ = 0;
        capacity_ = 0;
        growth_left() = 0;
    }